

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanscalar.cpp
# Opt level: O0

string * YAML::ScanScalar_abi_cxx11_(Stream *INPUT,ScanScalarParams *params)

{
  CharacterSet CVar1;
  Mark *pMVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  RegEx *pRVar6;
  int *piVar7;
  undefined8 uVar8;
  ulong uVar9;
  ulong uVar10;
  Stream *in_RDX;
  Stream *in_RSI;
  string *in_RDI;
  size_t pos_2;
  size_t pos_1;
  size_t pos;
  bool nextMoreIndented;
  bool nextEmptyLine;
  int n;
  char ch;
  bool escapedNewline;
  size_t lastNonWhitespaceChar;
  size_t lastEscapedChar;
  bool foldedNewlineStartedMoreIndented;
  int foldedNewlineCount;
  bool moreIndented;
  bool emptyLine;
  bool pastOpeningBreak;
  bool foundNonEmptyLine;
  string *scalar;
  Stream *in_stack_fffffffffffffd08;
  Stream *in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  Stream *in_stack_fffffffffffffd20;
  byte local_23e;
  byte local_1a3;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  allocator local_169;
  string local_168 [36];
  byte local_144;
  byte local_143;
  undefined1 local_142;
  allocator local_141;
  string local_140 [32];
  Mark local_120;
  Mark local_110;
  int local_104;
  int local_100;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [32];
  Mark local_d8;
  Mark local_c8;
  char local_b9;
  string local_b8 [38];
  undefined1 local_92;
  allocator local_91;
  string local_90 [32];
  Mark local_70;
  Mark local_60;
  byte local_51;
  ulong local_50;
  undefined1 local_31;
  ulong local_30;
  byte local_21;
  int local_20;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  byte local_19;
  
  local_19 = 0;
  local_1a = in_RDX->m_charSet == utf16be;
  local_1b = 0;
  local_1c = 0;
  local_20 = 0;
  local_21 = 0;
  local_30 = 0xffffffffffffffff;
  local_31 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  (in_RDX->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x10 = 0;
  if (in_RDX->m_input == (istream *)0x0) {
    pRVar6 = Exp::Empty();
    in_RDX->m_input = (istream *)pRVar6;
  }
LAB_00f1dac7:
  bVar3 = Stream::operator_cast_to_bool(in_stack_fffffffffffffd20);
  if (bVar3) {
    local_50 = std::__cxx11::string::size();
    local_51 = 0;
LAB_00f1db0a:
    bVar3 = RegEx::Matches((RegEx *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    local_1a3 = 0;
    if (!bVar3) {
      Exp::Break();
      bVar3 = RegEx::Matches((RegEx *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      local_1a3 = bVar3 ^ 0xff;
    }
    if (((local_1a3 & 1) == 0) || (bVar3 = Stream::operator!((Stream *)0xf1db9c), bVar3))
    goto LAB_00f1df7f;
    iVar5 = Stream::column(in_RSI);
    if (iVar5 == 0) {
      Exp::DocIndicator();
      bVar3 = RegEx::Matches((RegEx *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      if (bVar3) {
        if (*(int *)&(in_RDX->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                     field_0x8 == 1) goto LAB_00f1df7f;
        if (*(int *)&(in_RDX->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                     field_0x8 == 2) {
          local_92 = 1;
          uVar8 = __cxa_allocate_exception(0x40);
          local_70 = Stream::mark(in_RSI);
          local_60 = local_70;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_90,"illegal document indicator in scalar",&local_91);
          ParserException::ParserException
                    ((ParserException *)in_stack_fffffffffffffd20,
                     (Mark *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                     (string *)in_stack_fffffffffffffd10);
          local_92 = 0;
          __cxa_throw(uVar8,&ParserException::typeinfo,ParserException::~ParserException);
        }
      }
    }
    local_19 = 1;
    local_1a = 1;
    if (*(char *)((long)&(in_RDX->m_mark).column + 2) == '\\') {
      Exp::EscBreak();
      bVar3 = RegEx::Matches((RegEx *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      if (bVar3) goto LAB_00f1de06;
    }
    cVar4 = Stream::peek(in_stack_fffffffffffffd08);
    if (cVar4 == *(char *)((long)&(in_RDX->m_mark).column + 2)) {
      Exp::Escape_abi_cxx11_(in_RDX);
      std::__cxx11::string::operator+=((string *)in_RDI,local_b8);
      std::__cxx11::string::~string(local_b8);
      local_50 = std::__cxx11::string::size();
      local_30 = std::__cxx11::string::size();
    }
    else {
      local_b9 = Stream::get(in_stack_fffffffffffffd10);
      std::__cxx11::string::operator+=((string *)in_RDI,local_b9);
      if ((local_b9 != ' ') && (local_b9 != '\t')) {
        local_50 = std::__cxx11::string::size();
      }
    }
    goto LAB_00f1db0a;
  }
  goto LAB_00f1e98f;
LAB_00f1de06:
  Stream::get(in_stack_fffffffffffffd10);
  local_50 = std::__cxx11::string::size();
  local_30 = std::__cxx11::string::size();
  local_51 = 1;
LAB_00f1df7f:
  bVar3 = Stream::operator!((Stream *)0xf1df8c);
  if (bVar3) {
    if (((in_RDX->m_mark).pos & 1) != 0) {
      local_fa = 1;
      uVar8 = __cxa_allocate_exception(0x40);
      local_d8 = Stream::mark(in_RSI);
      local_c8 = local_d8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"illegal EOF in scalar",&local_f9);
      ParserException::ParserException
                ((ParserException *)in_stack_fffffffffffffd20,
                 (Mark *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 (string *)in_stack_fffffffffffffd10);
      local_fa = 0;
      __cxa_throw(uVar8,&ParserException::typeinfo,ParserException::~ParserException);
    }
    goto LAB_00f1e98f;
  }
  if ((*(int *)&(in_RDX->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                field_0x8 == 1) && (iVar5 = Stream::column(in_RSI), iVar5 == 0)) {
    Exp::DocIndicator();
    bVar3 = RegEx::Matches((RegEx *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    if (bVar3) goto LAB_00f1e98f;
  }
  local_100 = RegEx::Match((RegEx *)in_stack_fffffffffffffd20,
                           (Stream *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  if (-1 < local_100) {
    if (((in_RDX->m_mark).pos & 1) != 0) {
      Stream::eat(in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    }
    goto LAB_00f1e98f;
  }
  if (in_RDX->m_charSet == utf16be) {
    std::__cxx11::string::erase((ulong)in_RDI,local_50);
  }
  Exp::Break();
  local_100 = RegEx::Match((RegEx *)in_stack_fffffffffffffd20,
                           (Stream *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  Stream::eat(in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
  while( true ) {
    cVar4 = Stream::peek(in_stack_fffffffffffffd08);
    local_23e = 0;
    if ((cVar4 == ' ') &&
       ((iVar5 = Stream::column(in_RSI), iVar5 < (in_RDX->m_mark).line ||
        ((local_23e = 0, ((in_RDX->m_mark).column & 1) != 0 && (local_23e = 0, (local_19 & 1) == 0))
        )))) {
      bVar3 = RegEx::Matches((RegEx *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      local_23e = bVar3 ^ 0xff;
    }
    if ((local_23e & 1) == 0) break;
    Stream::eat(in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
  }
  if ((((in_RDX->m_mark).column & 1) != 0) && ((local_19 & 1) == 0)) {
    pMVar2 = &in_RDX->m_mark;
    local_104 = Stream::column(in_RSI);
    piVar7 = std::max<int>(&pMVar2->line,&local_104);
    (in_RDX->m_mark).line = *piVar7;
  }
  while( true ) {
    Exp::Blank();
    bVar3 = RegEx::Matches((RegEx *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    if (!bVar3) break;
    cVar4 = Stream::peek(in_stack_fffffffffffffd08);
    if (((cVar4 == '\t') && (iVar5 = Stream::column(in_RSI), iVar5 < (in_RDX->m_mark).line)) &&
       (*(int *)&(in_RDX->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                 field_0xc == 2)) {
      local_142 = 1;
      uVar8 = __cxa_allocate_exception(0x40);
      local_120 = Stream::mark(in_RSI);
      local_110 = local_120;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_140,"illegal tab when looking for indentation",&local_141);
      ParserException::ParserException
                ((ParserException *)in_stack_fffffffffffffd20,
                 (Mark *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 (string *)in_stack_fffffffffffffd10);
      local_142 = 0;
      __cxa_throw(uVar8,&ParserException::typeinfo,ParserException::~ParserException);
    }
    if ((((in_RDX->m_mark).column & 0x100) == 0) ||
       (bVar3 = RegEx::Matches((RegEx *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08), bVar3)
       ) break;
    Stream::eat(in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
  }
  Exp::Break();
  local_143 = RegEx::Matches((RegEx *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  Exp::Blank();
  local_144 = RegEx::Matches((RegEx *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  if ((in_RDX->m_charSet == utf16le) && ((local_20 == 0 && ((local_143 & 1) != 0)))) {
    local_21 = local_1c & 1;
  }
  if ((local_1a & 1) != 0) {
    CVar1 = in_RDX->m_charSet;
    if (CVar1 == utf8) {
      std::__cxx11::string::operator+=((string *)in_RDI,"\n");
    }
    else if (CVar1 == utf16le) {
      if (((((local_1b & 1) != 0) || ((local_143 & 1) != 0)) || ((local_1c & 1) != 0)) ||
         (((bool)local_144 || (iVar5 = Stream::column(in_RSI), iVar5 < (in_RDX->m_mark).line)))) {
        if ((local_143 & 1) == 0) {
          std::__cxx11::string::operator+=((string *)in_RDI,"\n");
        }
        else {
          local_20 = local_20 + 1;
        }
      }
      else {
        std::__cxx11::string::operator+=((string *)in_RDI," ");
      }
      if (((local_143 & 1) == 0) && (0 < local_20)) {
        iVar5 = local_20 + -1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_168,(long)iVar5,'\n',&local_169);
        std::__cxx11::string::operator+=((string *)in_RDI,local_168);
        std::__cxx11::string::~string(local_168);
        std::allocator<char>::~allocator((allocator<char> *)&local_169);
        if (((local_21 & 1) != 0) || ((local_144 & 1) != 0 || ((local_19 ^ 0xff) & 1) != 0)) {
          std::__cxx11::string::operator+=((string *)in_RDI,"\n");
        }
        local_20 = 0;
      }
    }
    else if (CVar1 == utf16be) {
      if ((local_143 & 1) == 0) {
        if (((local_1b & 1) == 0) && ((local_51 & 1) == 0)) {
          std::__cxx11::string::operator+=((string *)in_RDI," ");
        }
      }
      else {
        std::__cxx11::string::operator+=((string *)in_RDI,"\n");
      }
    }
  }
  local_1b = local_143 & 1;
  local_1c = local_144 & 1;
  local_1a = 1;
  if ((local_1b == 0) && (iVar5 = Stream::column(in_RSI), iVar5 < (in_RDX->m_mark).line)) {
    (in_RDX->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x10 = 1;
LAB_00f1e98f:
    if (((byte)(in_RDX->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
               super__Tp_alloc_type & 1) != 0) {
      local_178 = std::__cxx11::string::find_last_not_of((char *)in_RDI,0xf91186);
      if ((local_30 != 0xffffffffffffffff) &&
         ((local_178 < local_30 || (local_178 == 0xffffffffffffffff)))) {
        local_178 = local_30;
      }
      uVar10 = local_178;
      uVar9 = std::__cxx11::string::size();
      if (uVar10 < uVar9) {
        std::__cxx11::string::erase((ulong)in_RDI,local_178 + 1);
      }
    }
    iVar5 = *(int *)&(in_RDX->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                     field_0x4;
    if (iVar5 == -1) {
      local_188 = std::__cxx11::string::find_last_not_of((char)in_RDI,10);
      if ((local_30 != 0xffffffffffffffff) &&
         ((local_188 < local_30 || (local_188 == 0xffffffffffffffff)))) {
        local_188 = local_30;
      }
      if (local_188 == 0xffffffffffffffff) {
        std::__cxx11::string::erase((ulong)in_RDI,0);
      }
      else {
        uVar10 = local_188;
        uVar9 = std::__cxx11::string::size();
        if (uVar10 < uVar9) {
          std::__cxx11::string::erase((ulong)in_RDI,local_188 + 1);
        }
      }
    }
    else if (iVar5 == 0) {
      local_180 = std::__cxx11::string::find_last_not_of((char)in_RDI,10);
      if ((local_30 != 0xffffffffffffffff) &&
         ((local_180 < local_30 || (local_180 == 0xffffffffffffffff)))) {
        local_180 = local_30;
      }
      if (local_180 == 0xffffffffffffffff) {
        std::__cxx11::string::erase((ulong)in_RDI,0);
      }
      else {
        uVar10 = local_180 + 1;
        uVar9 = std::__cxx11::string::size();
        if (uVar10 < uVar9) {
          std::__cxx11::string::erase((ulong)in_RDI,local_180 + 2);
        }
      }
    }
    return in_RDI;
  }
  goto LAB_00f1dac7;
}

Assistant:

std::string ScanScalar(Stream& INPUT, ScanScalarParams& params) {
  bool foundNonEmptyLine = false;
  bool pastOpeningBreak = (params.fold == FOLD_FLOW);
  bool emptyLine = false, moreIndented = false;
  int foldedNewlineCount = 0;
  bool foldedNewlineStartedMoreIndented = false;
  std::size_t lastEscapedChar = std::string::npos;
  std::string scalar;
  params.leadingSpaces = false;

  if (!params.end) {
    params.end = &Exp::Empty();
  }

  while (INPUT) {
    // ********************************
    // Phase #1: scan until line ending

    std::size_t lastNonWhitespaceChar = scalar.size();
    bool escapedNewline = false;
    while (!params.end->Matches(INPUT) && !Exp::Break().Matches(INPUT)) {
      if (!INPUT) {
        break;
      }

      // document indicator?
      if (INPUT.column() == 0 && Exp::DocIndicator().Matches(INPUT)) {
        if (params.onDocIndicator == BREAK) {
          break;
        }
        if (params.onDocIndicator == THROW) {
          throw ParserException(INPUT.mark(), ErrorMsg::DOC_IN_SCALAR);
        }
      }

      foundNonEmptyLine = true;
      pastOpeningBreak = true;

      // escaped newline? (only if we're escaping on slash)
      if (params.escape == '\\' && Exp::EscBreak().Matches(INPUT)) {
        // eat escape character and get out (but preserve trailing whitespace!)
        INPUT.get();
        lastNonWhitespaceChar = scalar.size();
        lastEscapedChar = scalar.size();
        escapedNewline = true;
        break;
      }

      // escape this?
      if (INPUT.peek() == params.escape) {
        scalar += Exp::Escape(INPUT);
        lastNonWhitespaceChar = scalar.size();
        lastEscapedChar = scalar.size();
        continue;
      }

      // otherwise, just add the damn character
      char ch = INPUT.get();
      scalar += ch;
      if (ch != ' ' && ch != '\t') {
        lastNonWhitespaceChar = scalar.size();
      }
    }

    // eof? if we're looking to eat something, then we throw
    if (!INPUT) {
      if (params.eatEnd) {
        throw ParserException(INPUT.mark(), ErrorMsg::EOF_IN_SCALAR);
      }
      break;
    }

    // doc indicator?
    if (params.onDocIndicator == BREAK && INPUT.column() == 0 &&
        Exp::DocIndicator().Matches(INPUT)) {
      break;
    }

    // are we done via character match?
    int n = params.end->Match(INPUT);
    if (n >= 0) {
      if (params.eatEnd) {
        INPUT.eat(n);
      }
      break;
    }

    // do we remove trailing whitespace?
    if (params.fold == FOLD_FLOW)
      scalar.erase(lastNonWhitespaceChar);

    // ********************************
    // Phase #2: eat line ending
    n = Exp::Break().Match(INPUT);
    INPUT.eat(n);

    // ********************************
    // Phase #3: scan initial spaces

    // first the required indentation
    while (INPUT.peek() == ' ' &&
           (INPUT.column() < params.indent ||
            (params.detectIndent && !foundNonEmptyLine)) &&
           !params.end->Matches(INPUT)) {
      INPUT.eat(1);
    }

    // update indent if we're auto-detecting
    if (params.detectIndent && !foundNonEmptyLine) {
      params.indent = std::max(params.indent, INPUT.column());
    }

    // and then the rest of the whitespace
    while (Exp::Blank().Matches(INPUT)) {
      // we check for tabs that masquerade as indentation
      if (INPUT.peek() == '\t' && INPUT.column() < params.indent &&
          params.onTabInIndentation == THROW) {
        throw ParserException(INPUT.mark(), ErrorMsg::TAB_IN_INDENTATION);
      }

      if (!params.eatLeadingWhitespace) {
        break;
      }

      if (params.end->Matches(INPUT)) {
        break;
      }

      INPUT.eat(1);
    }

    // was this an empty line?
    bool nextEmptyLine = Exp::Break().Matches(INPUT);
    bool nextMoreIndented = Exp::Blank().Matches(INPUT);
    if (params.fold == FOLD_BLOCK && foldedNewlineCount == 0 && nextEmptyLine)
      foldedNewlineStartedMoreIndented = moreIndented;

    // for block scalars, we always start with a newline, so we should ignore it
    // (not fold or keep)
    if (pastOpeningBreak) {
      switch (params.fold) {
        case DONT_FOLD:
          scalar += "\n";
          break;
        case FOLD_BLOCK:
          if (!emptyLine && !nextEmptyLine && !moreIndented &&
              !nextMoreIndented && INPUT.column() >= params.indent) {
            scalar += " ";
          } else if (nextEmptyLine) {
            foldedNewlineCount++;
          } else {
            scalar += "\n";
          }

          if (!nextEmptyLine && foldedNewlineCount > 0) {
            scalar += std::string(foldedNewlineCount - 1, '\n');
            if (foldedNewlineStartedMoreIndented ||
                nextMoreIndented | !foundNonEmptyLine) {
              scalar += "\n";
            }
            foldedNewlineCount = 0;
          }
          break;
        case FOLD_FLOW:
          if (nextEmptyLine) {
            scalar += "\n";
          } else if (!emptyLine && !escapedNewline) {
            scalar += " ";
          }
          break;
      }
    }

    emptyLine = nextEmptyLine;
    moreIndented = nextMoreIndented;
    pastOpeningBreak = true;

    // are we done via indentation?
    if (!emptyLine && INPUT.column() < params.indent) {
      params.leadingSpaces = true;
      break;
    }
  }

  // post-processing
  if (params.trimTrailingSpaces) {
    std::size_t pos = scalar.find_last_not_of(" \t");
    if (lastEscapedChar != std::string::npos) {
      if (pos < lastEscapedChar || pos == std::string::npos) {
        pos = lastEscapedChar;
      }
    }
    if (pos < scalar.size()) {
      scalar.erase(pos + 1);
    }
  }

  switch (params.chomp) {
    case CLIP: {
      std::size_t pos = scalar.find_last_not_of('\n');
      if (lastEscapedChar != std::string::npos) {
        if (pos < lastEscapedChar || pos == std::string::npos) {
          pos = lastEscapedChar;
        }
      }
      if (pos == std::string::npos) {
        scalar.erase();
      } else if (pos + 1 < scalar.size()) {
        scalar.erase(pos + 2);
      }
    } break;
    case STRIP: {
      std::size_t pos = scalar.find_last_not_of('\n');
      if (lastEscapedChar != std::string::npos) {
        if (pos < lastEscapedChar || pos == std::string::npos) {
          pos = lastEscapedChar;
        }
      }
      if (pos == std::string::npos) {
        scalar.erase();
      } else if (pos < scalar.size()) {
        scalar.erase(pos + 1);
      }
    } break;
    default:
      break;
  }

  return scalar;
}